

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int32_t zng_deflateSetParams(zng_stream *strm,zng_deflate_param_value *params,size_t count)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int32_t iVar5;
  ulong in_RDX;
  long in_RSI;
  zng_stream *in_RDI;
  int val;
  int ret;
  int stream_error;
  int buf_error;
  int version_error;
  int param_buf_error;
  zng_deflate_param_value *new_reproducible;
  zng_deflate_param_value *new_strategy;
  zng_deflate_param_value *new_level;
  deflate_state *s;
  size_t i;
  int32_t local_80;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int local_4c;
  zng_deflate_param_value *local_48;
  zng_deflate_param_value *local_40;
  zng_deflate_param_value *local_38;
  internal_state *local_30;
  ulong local_28;
  ulong local_20;
  long local_18;
  zng_stream *local_10;
  int32_t local_4;
  
  local_38 = (zng_deflate_param_value *)0x0;
  local_40 = (zng_deflate_param_value *)0x0;
  local_48 = (zng_deflate_param_value *)0x0;
  bVar3 = false;
  bVar1 = false;
  bVar2 = false;
  for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 1) {
    *(undefined4 *)(in_RSI + local_28 * 0x20 + 0x18) = 0;
  }
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar4 = deflateStateCheck(in_RDI);
  if (iVar4 == 0) {
    local_30 = local_10->state;
    for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
      in_stack_ffffffffffffff9c = *(int *)(local_18 + local_28 * 0x20);
      if (in_stack_ffffffffffffff9c == 0) {
        local_4c = deflateSetParamPre(&local_38,4,
                                      (zng_deflate_param_value *)(local_18 + local_28 * 0x20));
      }
      else if (in_stack_ffffffffffffff9c == 1) {
        local_4c = deflateSetParamPre(&local_40,4,
                                      (zng_deflate_param_value *)(local_18 + local_28 * 0x20));
      }
      else if (in_stack_ffffffffffffff9c == 2) {
        local_4c = deflateSetParamPre(&local_48,4,
                                      (zng_deflate_param_value *)(local_18 + local_28 * 0x20));
      }
      else {
        *(undefined4 *)(local_18 + local_28 * 0x20 + 0x18) = 0xfffffffa;
        bVar3 = true;
        local_4c = 0;
      }
      if (local_4c != 0) {
        *(undefined4 *)(local_18 + local_28 * 0x20 + 0x18) = 0xfffffffb;
        bVar1 = true;
      }
    }
    if (bVar1) {
      local_4 = -5;
    }
    else {
      if (((local_38 != (zng_deflate_param_value *)0x0) ||
          (local_40 != (zng_deflate_param_value *)0x0)) &&
         (iVar5 = zng_deflateParams((zng_stream *)
                                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                    (int32_t)((ulong)local_10 >> 0x20),(int32_t)local_10),
         iVar5 != 0)) {
        if (local_38 != (zng_deflate_param_value *)0x0) {
          local_38->status = -2;
        }
        if (local_40 != (zng_deflate_param_value *)0x0) {
          local_40->status = -2;
        }
        bVar2 = true;
      }
      if (local_48 != (zng_deflate_param_value *)0x0) {
        local_30->reproducible = *local_48->buf;
      }
      if (bVar2) {
        local_80 = -2;
      }
      else {
        local_80 = 0;
        if (bVar3) {
          local_80 = -6;
        }
      }
      local_4 = local_80;
    }
  }
  else {
    local_4 = -2;
  }
  return local_4;
}

Assistant:

int32_t Z_EXPORT zng_deflateSetParams(zng_stream *strm, zng_deflate_param_value *params, size_t count) {
    size_t i;
    deflate_state *s;
    zng_deflate_param_value *new_level = NULL;
    zng_deflate_param_value *new_strategy = NULL;
    zng_deflate_param_value *new_reproducible = NULL;
    int param_buf_error;
    int version_error = 0;
    int buf_error = 0;
    int stream_error = 0;

    /* Initialize the statuses. */
    for (i = 0; i < count; i++)
        params[i].status = Z_OK;

    /* Check whether the stream state is consistent. */
    if (deflateStateCheck(strm))
        return Z_STREAM_ERROR;
    s = strm->state;

    /* Check buffer sizes and detect duplicates. */
    for (i = 0; i < count; i++) {
        switch (params[i].param) {
            case Z_DEFLATE_LEVEL:
                param_buf_error = deflateSetParamPre(&new_level, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_STRATEGY:
                param_buf_error = deflateSetParamPre(&new_strategy, sizeof(int), &params[i]);
                break;
            case Z_DEFLATE_REPRODUCIBLE:
                param_buf_error = deflateSetParamPre(&new_reproducible, sizeof(int), &params[i]);
                break;
            default:
                params[i].status = Z_VERSION_ERROR;
                version_error = 1;
                param_buf_error = 0;
                break;
        }
        if (param_buf_error) {
            params[i].status = Z_BUF_ERROR;
            buf_error = 1;
        }
    }
    /* Exit early if small buffers or duplicates are detected. */
    if (buf_error)
        return Z_BUF_ERROR;

    /* Apply changes, remember if there were errors. */
    if (new_level != NULL || new_strategy != NULL) {
        int ret = PREFIX(deflateParams)(strm, new_level == NULL ? s->level : *(int *)new_level->buf,
                                        new_strategy == NULL ? s->strategy : *(int *)new_strategy->buf);
        if (ret != Z_OK) {
            if (new_level != NULL)
                new_level->status = Z_STREAM_ERROR;
            if (new_strategy != NULL)
                new_strategy->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }
    if (new_reproducible != NULL) {
        int val = *(int *)new_reproducible->buf;
        if (DEFLATE_CAN_SET_REPRODUCIBLE(strm, val)) {
            s->reproducible = val;
        } else {
            new_reproducible->status = Z_STREAM_ERROR;
            stream_error = 1;
        }
    }

    /* Report version errors only if there are no real errors. */
    return stream_error ? Z_STREAM_ERROR : (version_error ? Z_VERSION_ERROR : Z_OK);
}